

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::serializer(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *this,output_adapter_t<char> *s,char ichar,error_handler_t error_handler_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char cVar2;
  lconv *plVar3;
  
  (this->o).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (s->
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  cVar2 = '\0';
  (this->o).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (s->
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (s->
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->o).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (s->
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  (this->number_buffer)._M_elems[0x30] = '\0';
  (this->number_buffer)._M_elems[0x31] = '\0';
  (this->number_buffer)._M_elems[0x32] = '\0';
  (this->number_buffer)._M_elems[0x33] = '\0';
  (this->number_buffer)._M_elems[0x34] = '\0';
  (this->number_buffer)._M_elems[0x35] = '\0';
  (this->number_buffer)._M_elems[0x36] = '\0';
  (this->number_buffer)._M_elems[0x37] = '\0';
  (this->number_buffer)._M_elems[0x38] = '\0';
  (this->number_buffer)._M_elems[0x39] = '\0';
  (this->number_buffer)._M_elems[0x3a] = '\0';
  (this->number_buffer)._M_elems[0x3b] = '\0';
  (this->number_buffer)._M_elems[0x3c] = '\0';
  (this->number_buffer)._M_elems[0x3d] = '\0';
  (this->number_buffer)._M_elems[0x3e] = '\0';
  (this->number_buffer)._M_elems[0x3f] = '\0';
  (this->number_buffer)._M_elems[0x20] = '\0';
  (this->number_buffer)._M_elems[0x21] = '\0';
  (this->number_buffer)._M_elems[0x22] = '\0';
  (this->number_buffer)._M_elems[0x23] = '\0';
  (this->number_buffer)._M_elems[0x24] = '\0';
  (this->number_buffer)._M_elems[0x25] = '\0';
  (this->number_buffer)._M_elems[0x26] = '\0';
  (this->number_buffer)._M_elems[0x27] = '\0';
  (this->number_buffer)._M_elems[0x28] = '\0';
  (this->number_buffer)._M_elems[0x29] = '\0';
  (this->number_buffer)._M_elems[0x2a] = '\0';
  (this->number_buffer)._M_elems[0x2b] = '\0';
  (this->number_buffer)._M_elems[0x2c] = '\0';
  (this->number_buffer)._M_elems[0x2d] = '\0';
  (this->number_buffer)._M_elems[0x2e] = '\0';
  (this->number_buffer)._M_elems[0x2f] = '\0';
  (this->number_buffer)._M_elems[0x10] = '\0';
  (this->number_buffer)._M_elems[0x11] = '\0';
  (this->number_buffer)._M_elems[0x12] = '\0';
  (this->number_buffer)._M_elems[0x13] = '\0';
  (this->number_buffer)._M_elems[0x14] = '\0';
  (this->number_buffer)._M_elems[0x15] = '\0';
  (this->number_buffer)._M_elems[0x16] = '\0';
  (this->number_buffer)._M_elems[0x17] = '\0';
  (this->number_buffer)._M_elems[0x18] = '\0';
  (this->number_buffer)._M_elems[0x19] = '\0';
  (this->number_buffer)._M_elems[0x1a] = '\0';
  (this->number_buffer)._M_elems[0x1b] = '\0';
  (this->number_buffer)._M_elems[0x1c] = '\0';
  (this->number_buffer)._M_elems[0x1d] = '\0';
  (this->number_buffer)._M_elems[0x1e] = '\0';
  (this->number_buffer)._M_elems[0x1f] = '\0';
  (this->number_buffer)._M_elems[0] = '\0';
  (this->number_buffer)._M_elems[1] = '\0';
  (this->number_buffer)._M_elems[2] = '\0';
  (this->number_buffer)._M_elems[3] = '\0';
  (this->number_buffer)._M_elems[4] = '\0';
  (this->number_buffer)._M_elems[5] = '\0';
  (this->number_buffer)._M_elems[6] = '\0';
  (this->number_buffer)._M_elems[7] = '\0';
  (this->number_buffer)._M_elems[8] = '\0';
  (this->number_buffer)._M_elems[9] = '\0';
  (this->number_buffer)._M_elems[10] = '\0';
  (this->number_buffer)._M_elems[0xb] = '\0';
  (this->number_buffer)._M_elems[0xc] = '\0';
  (this->number_buffer)._M_elems[0xd] = '\0';
  (this->number_buffer)._M_elems[0xe] = '\0';
  (this->number_buffer)._M_elems[0xf] = '\0';
  plVar3 = localeconv();
  this->loc = (lconv *)plVar3;
  if (plVar3->thousands_sep != (char *)0x0) {
    cVar2 = *plVar3->thousands_sep;
  }
  this->thousands_sep = cVar2;
  if (plVar3->decimal_point == (char *)0x0) {
    cVar2 = '\0';
  }
  else {
    cVar2 = *plVar3->decimal_point;
  }
  this->decimal_point = cVar2;
  memset(&this->string_buffer,0,0x200);
  this->indent_char = ichar;
  (this->indent_string)._M_dataplus._M_p = (pointer)&(this->indent_string).field_2;
  std::__cxx11::string::_M_construct((ulong)&this->indent_string,'\0');
  this->error_handler = error_handler_;
  return;
}

Assistant:

serializer(output_adapter_t<char> s, const char ichar,
                error_handler_t error_handler_ = error_handler_t::strict)
                : o(std::move(s))
                , loc(std::localeconv())
                , thousands_sep(loc->thousands_sep == nullptr ? '\0' : std::char_traits<char>::to_char_type(*(loc->thousands_sep)))
                , decimal_point(loc->decimal_point == nullptr ? '\0' : std::char_traits<char>::to_char_type(*(loc->decimal_point)))
                , indent_char(ichar)
                , indent_string(512, indent_char)
                , error_handler(error_handler_)
            {}